

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O2

ScalarFunctionSet * duckdb::EpochUsFun::GetFunctions(void)

{
  scalar_function_t timetz_func;
  LogicalType varargs;
  ScalarFunctionSet *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  undefined4 uVar1;
  undefined4 uVar2;
  function_statistics_t ts_stats;
  undefined1 null_handling;
  undefined8 in_stack_fffffffffffffd88;
  undefined8 in_stack_fffffffffffffd90;
  undefined8 bind_lambda;
  scalar_function_t local_258;
  LogicalType local_238;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_220;
  LogicalType local_208;
  LogicalType local_1f0;
  scalar_function_t local_1d8;
  _Function_base local_1b8;
  code *local_1a0;
  scalar_function_t local_198;
  scalar_function_t local_178;
  ScalarFunction local_158;
  
  ts_stats = (function_statistics_t)0xc5108f;
  LogicalType::LogicalType(&local_1f0,BIGINT);
  local_258.super__Function_base._M_functor._8_8_ = 0;
  local_258.super__Function_base._M_functor._M_unused._M_object =
       DatePart::UnaryFunction<duckdb::date_t,long,duckdb::DatePart::EpochMicrosecondsOperator>;
  local_258._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_258.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  local_1d8.super__Function_base._M_functor._8_8_ = 0;
  local_1d8.super__Function_base._M_functor._M_unused._M_object =
       DatePart::UnaryFunction<duckdb::timestamp_t,long,duckdb::DatePart::EpochMicrosecondsOperator>
  ;
  local_1d8._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_1d8.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  local_178.super__Function_base._M_functor._8_8_ = 0;
  local_178.super__Function_base._M_functor._M_unused._M_object =
       ScalarFunction::
       UnaryFunction<duckdb::interval_t,long,duckdb::DatePart::EpochMicrosecondsOperator>;
  local_178._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_178.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  local_198.super__Function_base._M_functor._8_8_ = 0;
  local_198.super__Function_base._M_functor._M_unused._M_object =
       ScalarFunction::
       UnaryFunction<duckdb::dtime_t,long,duckdb::DatePart::EpochMicrosecondsOperator>;
  local_198._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_198.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  local_1b8._M_functor._8_8_ = 0;
  local_1b8._M_functor._M_unused._M_object =
       ScalarFunction::
       UnaryFunction<duckdb::dtime_tz_t,long,duckdb::DatePart::EpochMicrosecondsOperator>;
  local_1a0 = ::std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_1b8._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  uVar2 = 0;
  uVar1 = 0;
  timetz_func.super__Function_base._M_functor._8_8_ =
       DatePart::EpochMicrosecondsOperator::PropagateStatistics<duckdb::date_t>;
  timetz_func.super__Function_base._M_functor._M_unused._M_object = &local_1b8;
  timetz_func.super__Function_base._M_manager =
       DatePart::EpochMicrosecondsOperator::PropagateStatistics<duckdb::timestamp_t>;
  timetz_func._M_invoker._0_4_ = 0xcb5dbe;
  timetz_func._M_invoker._4_4_ = 0;
  GetGenericTimePartFunction
            (in_RDI,&local_1f0,&local_258,&local_1d8,&local_178,&local_198,timetz_func,
             DatePart::EpochMicrosecondsOperator::PropagateStatistics<duckdb::dtime_tz_t>,ts_stats,
             (function_statistics_t)in_stack_fffffffffffffd88,
             (function_statistics_t)in_stack_fffffffffffffd90);
  ::std::_Function_base::~_Function_base(&local_1b8);
  ::std::_Function_base::~_Function_base(&local_198.super__Function_base);
  ::std::_Function_base::~_Function_base(&local_178.super__Function_base);
  ::std::_Function_base::~_Function_base(&local_1d8.super__Function_base);
  ::std::_Function_base::~_Function_base(&local_258.super__Function_base);
  LogicalType::~LogicalType(&local_1f0);
  LogicalType::LogicalType((LogicalType *)&local_258,TIMESTAMP_TZ);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_258;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_220,__l,(allocator_type *)&local_1d8);
  LogicalType::LogicalType(&local_238,BIGINT);
  bind_lambda = (bind_lambda_function_t)0x0;
  null_handling = 10;
  LogicalType::LogicalType(&local_208,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_208;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = uVar1;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = uVar2;
  ScalarFunction::ScalarFunction
            (&local_158,(vector<duckdb::LogicalType,_true> *)&local_220,&local_238,
             (scalar_function_t *)&stack0xfffffffffffffd88,(bind_scalar_function_t)0x0,
             (bind_scalar_function_extended_t)0x0,
             DatePart::EpochMicrosecondsOperator::PropagateStatistics<duckdb::timestamp_t>,
             (init_local_state_t)0x0,varargs,CONSISTENT,null_handling,
             (bind_lambda_function_t)bind_lambda);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
              super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_158);
  ScalarFunction::~ScalarFunction(&local_158);
  LogicalType::~LogicalType(&local_208);
  ::std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffffd88);
  LogicalType::~LogicalType(&local_238);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_220);
  LogicalType::~LogicalType((LogicalType *)&local_258);
  return in_RDI;
}

Assistant:

ScalarFunctionSet EpochUsFun::GetFunctions() {
	using OP = DatePart::EpochMicrosecondsOperator;
	auto operator_set = GetTimePartFunction<OP>();

	//	TIMESTAMP WITH TIME ZONE has the same representation as TIMESTAMP so no need to defer to ICU
	auto tstz_func = DatePart::UnaryFunction<timestamp_t, int64_t, OP>;
	auto tstz_stats = OP::template PropagateStatistics<timestamp_t>;
	operator_set.AddFunction(
	    ScalarFunction({LogicalType::TIMESTAMP_TZ}, LogicalType::BIGINT, tstz_func, nullptr, nullptr, tstz_stats));
	return operator_set;
}